

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult cmCMakePresetsGraphInternal::PresetIntHelper(int *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  
  if (PresetIntHelper(int&,Json::Value_const*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetIntHelper(int&,Json::Value_const*)::helper);
    if (iVar2 != 0) {
      PresetIntHelper::helper.super__Function_base._M_functor._8_8_ = 0;
      PresetIntHelper::helper.super__Function_base._M_functor._M_unused._M_object =
           (void *)0xa00000000;
      PresetIntHelper::helper._M_invoker =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:152:12)>
           ::_M_invoke;
      PresetIntHelper::helper.super__Function_base._M_manager =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:152:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetIntHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetIntHelper(int&,Json::Value_const*)::helper);
    }
  }
  RVar1 = std::function<cmCMakePresetsGraph::ReadFileResult_(int_&,_const_Json::Value_*)>::
          operator()(&PresetIntHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetIntHelper(int& out,
                                                    const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Int(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}